

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_signalfd_epoll.c
# Opt level: O3

void copy_fd(int in,int out)

{
  int iVar1;
  ssize_t sVar2;
  size_t __n;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  char buff [1024];
  int aiStack_560 [30];
  code *pcStack_4e8;
  code *pcStack_4e0;
  code *pcStack_4d8;
  itimerval iStack_4c8;
  sigset_t sStack_4a8;
  ulong uStack_428;
  code *pcStack_420;
  char acStack_418 [1024];
  
  pcVar5 = acStack_418;
  pcStack_420 = (code *)0x101461;
  memset(acStack_418,0,0x400);
  pcStack_420 = (code *)0x101470;
  sVar2 = read(in,acStack_418,0x3ff);
  if ((int)sVar2 == 0) {
    return;
  }
  if ((int)sVar2 != -1) {
    pcStack_420 = (code *)0x101484;
    __n = strlen(acStack_418);
    pcStack_420 = (code *)0x101491;
    write(out,acStack_418,__n);
    return;
  }
  pcStack_420 = setup_signals;
  copy_fd_cold_1();
  uStack_428 = (ulong)(uint)out;
  if (in < 2) {
    pcStack_4d8 = (code *)0x101507;
    pcStack_420 = (code *)acStack_418;
    puts("No alarm set. Will default to 5 seconds.");
    pcStack_4d8 = (code *)0x10150c;
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = 5;
LAB_00101517:
    pcStack_4d8 = (code *)0x101524;
    sigemptyset(&sStack_4a8);
    pcStack_4d8 = (code *)0x101531;
    sigaddset(&sStack_4a8,0xe);
    pcStack_4d8 = (code *)0x10153e;
    sigaddset(&sStack_4a8,3);
    pcStack_4d8 = (code *)0x10154a;
    iVar1 = sigprocmask(0,&sStack_4a8,(sigset_t *)0x0);
    if (iVar1 == -1) {
      pcStack_4d8 = (code *)0x1015be;
      setup_signals_cold_4();
LAB_001015be:
      pcStack_4d8 = (code *)0x1015c3;
      setup_signals_cold_3();
    }
    else {
      pcStack_4d8 = (code *)0x101560;
      sfd = signalfd(-1,&sStack_4a8,0);
      if (sfd == -1) goto LAB_001015be;
      iStack_4c8.it_interval.tv_usec = 0;
      iStack_4c8.it_value.tv_usec = 0;
      pcStack_4d8 = (code *)0x101593;
      iStack_4c8.it_interval.tv_sec = lVar4;
      iStack_4c8.it_value.tv_sec = lVar4;
      iVar1 = setitimer(ITIMER_REAL,&iStack_4c8,(itimerval *)0x0);
      if (iVar1 != -1) {
        return;
      }
    }
    pcStack_4d8 = (code *)0x1015c8;
    setup_signals_cold_2();
  }
  else {
    pcStack_4d8 = (code *)0x1014b9;
    pcStack_420 = (code *)acStack_418;
    piVar3 = __errno_location();
    *piVar3 = 0;
    pcStack_4d8 = (code *)0x1014d2;
    lVar4 = strtol(*(char **)(pcVar5 + 8),(char **)0x0,10);
    if (*piVar3 == 0) {
      if (lVar4 == 0) {
        puts("No alarm set. Will default to 5 seconds.");
        return;
      }
      pcStack_4d8 = (code *)0x1014f9;
      printf("Alarm set every %ld seconds.\n",lVar4);
      goto LAB_00101517;
    }
  }
  pcStack_4d8 = setup_epoll;
  setup_signals_cold_1();
  iVar1 = 0;
  pcStack_4e0 = (code *)0x1015d5;
  epollfd = epoll_create1(0);
  if (epollfd != -1) {
    return;
  }
  pcStack_4e0 = add_fd_to_epoll;
  setup_epoll_cold_1();
  ev.events = 1;
  pcStack_4e8 = (code *)0x101611;
  ev.data.fd = iVar1;
  iVar1 = epoll_ctl(epollfd,1,iVar1,(epoll_event *)&ev);
  if (iVar1 != -1) {
    return;
  }
  pcStack_4e8 = handle_signals;
  add_fd_to_epoll_cold_1();
  sVar2 = read(sfd,aiStack_560,0x80);
  if (sVar2 == -1) {
    handle_signals_cold_1();
LAB_0010166e:
    puts("Got SIGQUIT. Will exit.");
    exit(0);
  }
  if (aiStack_560[0] == 0xe) {
    pcVar5 = "Got SIGALRM via SignalFD.";
  }
  else {
    if (aiStack_560[0] == 3) goto LAB_0010166e;
    pcVar5 = "Got unexpected signal!";
  }
  puts(pcVar5);
  return;
}

Assistant:

void copy_fd(int in, int out) {
    char buff[1024];
    int bytes_read;

    bzero(buff, sizeof(buff));
    bytes_read = read(in, buff, sizeof(buff)-1 );
    if (bytes_read == -1)
        handle_error("read");
    else if (bytes_read == 0)
        return;
    write(out, buff, strlen(buff));
}